

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEnable.c
# Opt level: O1

Gia_Man_t * Gia_ManUnrollInit(Gia_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  Gia_Obj_t *pGVar5;
  Gia_Obj_t *pGVar6;
  ulong uVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  int *piVar11;
  Gia_Man_t *p_00;
  size_t sVar12;
  char *pcVar13;
  Vec_Int_t *pVVar14;
  Gia_Obj_t *pGVar15;
  int iVar16;
  Gia_Obj_t *pGVar17;
  long lVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  
  uVar20 = (long)nFrames * (long)p->nObjs;
  iVar10 = (int)uVar20;
  if ((p->vCopies).nCap < iVar10) {
    piVar11 = (p->vCopies).pArray;
    if (piVar11 == (int *)0x0) {
      piVar11 = (int *)malloc(uVar20 * 4);
    }
    else {
      piVar11 = (int *)realloc(piVar11,uVar20 * 4);
    }
    (p->vCopies).pArray = piVar11;
    if (piVar11 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (p->vCopies).nCap = iVar10;
  }
  if (0 < iVar10) {
    memset((p->vCopies).pArray,0xff,(uVar20 & 0xffffffff) << 2);
  }
  (p->vCopies).nSize = iVar10;
  p_00 = Gia_ManStart(p->nObjs * nFrames);
  pcVar4 = p->pName;
  if (pcVar4 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar4);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar4);
  }
  p_00->pName = pcVar13;
  pcVar4 = p->pSpec;
  if (pcVar4 == (char *)0x0) {
    pcVar13 = (char *)0x0;
  }
  else {
    sVar12 = strlen(pcVar4);
    pcVar13 = (char *)malloc(sVar12 + 1);
    strcpy(pcVar13,pcVar4);
  }
  p_00->pSpec = pcVar13;
  Gia_ManHashAlloc(p_00);
  iVar10 = p->nRegs;
  if (0 < iVar10) {
    pVVar14 = p->vCis;
    iVar16 = 0;
    do {
      iVar9 = pVVar14->nSize;
      uVar19 = (iVar9 - iVar10) + iVar16;
      if (((int)uVar19 < 0) || (iVar9 <= (int)uVar19)) {
LAB_0068ac3b:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar10 = pVVar14->pArray[uVar19];
      if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) {
LAB_0068ac5a:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      if ((p->vCopies).nSize <= iVar10) goto LAB_0068ac79;
      (p->vCopies).pArray[iVar10] = 0;
      iVar16 = iVar16 + 1;
      iVar10 = p->nRegs;
    } while (iVar16 < iVar10);
  }
  if (0 < nFrames) {
    iVar10 = p->nObjs;
    if (0 < iVar10) {
      iVar16 = 0;
      do {
        if ((p->vCopies).nSize <= iVar10 * iVar16) {
LAB_0068ac79:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                        ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        (p->vCopies).pArray[(uint)(iVar10 * iVar16)] = 0;
        pVVar14 = p->vCis;
        uVar20 = (ulong)(uint)pVVar14->nSize;
        if (p->nRegs < pVVar14->nSize) {
          lVar18 = 0;
          do {
            if ((int)uVar20 <= lVar18) goto LAB_0068ac3b;
            iVar10 = pVVar14->pArray[lVar18];
            if (((long)iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0068ac5a;
            pGVar17 = p->pObjs;
            if (pGVar17 == (Gia_Obj_t *)0x0) break;
            pGVar15 = Gia_ManAppendObj(p_00);
            uVar20 = *(ulong *)pGVar15;
            *(ulong *)pGVar15 = uVar20 | 0x9fffffff;
            *(ulong *)pGVar15 =
                 uVar20 & 0xe0000000ffffffff | 0x9fffffff |
                 (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
            pGVar5 = p_00->pObjs;
            if ((pGVar15 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar15)) goto LAB_0068ac02;
            Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar15 - (long)pGVar5) >> 2) * -0x55555555);
            pGVar5 = p_00->pObjs;
            if ((pGVar15 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar15)) goto LAB_0068ac02;
            pGVar17 = pGVar17 + iVar10;
            pGVar6 = p->pObjs;
            if ((pGVar17 < pGVar6) || (pGVar6 + p->nObjs <= pGVar17)) goto LAB_0068ac02;
            uVar19 = (int)((ulong)((long)pGVar17 - (long)pGVar6) >> 2) * -0x55555555 +
                     p->nObjs * iVar16;
            if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) goto LAB_0068ac79;
            (p->vCopies).pArray[uVar19] =
                 (int)((ulong)((long)pGVar15 - (long)pGVar5) >> 2) * 0x55555556;
            lVar18 = lVar18 + 1;
            pVVar14 = p->vCis;
            uVar20 = (ulong)pVVar14->nSize;
          } while (lVar18 < (long)(uVar20 - (long)p->nRegs));
        }
        uVar20 = (ulong)(uint)p->nObjs;
        if (0 < p->nObjs) {
          lVar23 = 0;
          lVar18 = 0;
          do {
            pGVar17 = p->pObjs;
            if (pGVar17 == (Gia_Obj_t *)0x0) break;
            pGVar5 = (Gia_Obj_t *)(&pGVar17->field_0x0 + lVar23);
            uVar7 = *(ulong *)pGVar5;
            if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
              iVar10 = (int)(uVar7 & 0x1fffffff);
              pGVar15 = (Gia_Obj_t *)(lVar23 + (ulong)(uint)(iVar10 * 4) * -3 + (long)pGVar17);
              if (pGVar15 < pGVar17) goto LAB_0068ac02;
              if (pGVar17 + (int)uVar20 <= pGVar15) goto LAB_0068ac02;
              iVar9 = (int)uVar20 * iVar16;
              uVar19 = (int)(lVar23 + (ulong)(uint)(iVar10 << 2) * -3 >> 2) * -0x55555555 + iVar9;
              if (((int)uVar19 < 0) || (iVar10 = (p->vCopies).nSize, iVar10 <= (int)uVar19))
              goto LAB_0068ac3b;
              piVar11 = (p->vCopies).pArray;
              uVar19 = piVar11[uVar19];
              if ((int)uVar19 < 0) goto LAB_0068ac98;
              uVar22 = (uint)(uVar7 >> 0x20);
              uVar21 = uVar22 & 0x1fffffff;
              pGVar15 = (Gia_Obj_t *)(lVar23 + (ulong)(uVar21 * 4) * -3 + (long)pGVar17);
              if ((pGVar15 < pGVar17) || (pGVar17 + (int)uVar20 <= pGVar15)) goto LAB_0068ac02;
              uVar21 = iVar9 + (int)(lVar23 + (ulong)(uVar21 << 2) * -3 >> 2) * -0x55555555;
              if (((int)uVar21 < 0) || (iVar10 <= (int)uVar21)) goto LAB_0068ac3b;
              uVar21 = piVar11[uVar21];
              if ((int)uVar21 < 0) goto LAB_0068ac98;
              iVar10 = Gia_ManHashAnd(p_00,uVar19 ^ (uint)(uVar7 >> 0x1d) & 1,
                                      uVar21 ^ uVar22 >> 0x1d & 1);
              pGVar15 = p->pObjs;
              if ((pGVar5 < pGVar15) || (pGVar15 + p->nObjs <= pGVar5)) goto LAB_0068ac02;
              uVar19 = (int)((ulong)((long)pGVar17 + (lVar23 - (long)pGVar15)) >> 2) * -0x55555555 +
                       p->nObjs * iVar16;
              if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) goto LAB_0068ac79;
              (p->vCopies).pArray[uVar19] = iVar10;
            }
            lVar18 = lVar18 + 1;
            uVar20 = (ulong)p->nObjs;
            lVar23 = lVar23 + 0xc;
          } while (lVar18 < (long)uVar20);
        }
        pVVar14 = p->vCos;
        if (0 < pVVar14->nSize) {
          piVar11 = pVVar14->pArray;
          lVar18 = 0;
          do {
            iVar10 = piVar11[lVar18];
            if ((long)iVar10 < 0) goto LAB_0068ac5a;
            iVar9 = p->nObjs;
            if (iVar9 <= iVar10) goto LAB_0068ac5a;
            pGVar17 = p->pObjs;
            if (pGVar17 == (Gia_Obj_t *)0x0) break;
            uVar19 = (uint)*(undefined8 *)(pGVar17 + iVar10);
            pGVar5 = pGVar17 + iVar10 + -(ulong)(uVar19 & 0x1fffffff);
            if ((pGVar5 < pGVar17) || (pGVar17 + iVar9 <= pGVar5)) goto LAB_0068ac02;
            uVar22 = (int)((ulong)((long)pGVar5 - (long)pGVar17) >> 2) * -0x55555555 +
                     iVar9 * iVar16;
            if (((int)uVar22 < 0) || (iVar1 = (p->vCopies).nSize, iVar1 <= (int)uVar22))
            goto LAB_0068ac3b;
            piVar8 = (p->vCopies).pArray;
            uVar22 = piVar8[uVar22];
            if ((int)uVar22 < 0) {
LAB_0068ac98:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                            ,0x10f,"int Abc_LitNotCond(int, int)");
            }
            uVar21 = iVar9 * iVar16 + iVar10;
            if (((int)uVar21 < 0) || (iVar1 <= (int)uVar21)) goto LAB_0068ac79;
            piVar8[uVar21] = uVar22 ^ uVar19 >> 0x1d & 1;
            lVar18 = lVar18 + 1;
          } while (lVar18 < pVVar14->nSize);
        }
        pVVar14 = p->vCos;
        uVar20 = (ulong)(uint)pVVar14->nSize;
        if (p->nRegs < pVVar14->nSize) {
          lVar18 = 0;
          do {
            if ((int)uVar20 <= lVar18) goto LAB_0068ac3b;
            iVar10 = pVVar14->pArray[lVar18];
            if ((iVar10 < 0) || (p->nObjs <= iVar10)) goto LAB_0068ac5a;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            uVar19 = p->nObjs * iVar16 + iVar10;
            if (((int)uVar19 < 0) || ((p->vCopies).nSize <= (int)uVar19)) goto LAB_0068ac3b;
            Gia_ManAppendCo(p_00,(p->vCopies).pArray[uVar19]);
            lVar18 = lVar18 + 1;
            pVVar14 = p->vCos;
            uVar20 = (ulong)pVVar14->nSize;
          } while (lVar18 < (long)(uVar20 - (long)p->nRegs));
        }
        if (iVar16 == nFrames + -1) goto LAB_0068ac21;
        iVar10 = p->nRegs;
        if (0 < iVar10) {
          iVar9 = 0;
          do {
            uVar19 = (pVVar14->nSize - iVar10) + iVar9;
            if (((int)uVar19 < 0) || (pVVar14->nSize <= (int)uVar19)) goto LAB_0068ac3b;
            iVar1 = pVVar14->pArray[uVar19];
            if ((iVar1 < 0) || (iVar2 = p->nObjs, iVar2 <= iVar1)) goto LAB_0068ac5a;
            if (p->pObjs == (Gia_Obj_t *)0x0) break;
            iVar3 = p->vCis->nSize;
            uVar19 = (iVar3 - iVar10) + iVar9;
            if (((int)uVar19 < 0) || (iVar3 <= (int)uVar19)) goto LAB_0068ac3b;
            iVar10 = p->vCis->pArray[uVar19];
            if ((iVar10 < 0) || (iVar2 <= iVar10)) goto LAB_0068ac5a;
            uVar19 = iVar2 * iVar16 + iVar1;
            if (((int)uVar19 < 0) || (iVar1 = (p->vCopies).nSize, iVar1 <= (int)uVar19))
            goto LAB_0068ac3b;
            uVar22 = iVar10 + iVar2 * (iVar16 + 1);
            if (((int)uVar22 < 0) || (iVar1 <= (int)uVar22)) goto LAB_0068ac79;
            piVar11 = (p->vCopies).pArray;
            piVar11[uVar22] = piVar11[uVar19];
            iVar9 = iVar9 + 1;
            iVar10 = p->nRegs;
          } while (iVar9 < iVar10);
        }
        iVar16 = iVar16 + 1;
        iVar10 = p->nObjs;
      } while (0 < iVar10);
    }
LAB_0068ac02:
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
LAB_0068ac21:
  Gia_ManHashStop(p_00);
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManUnrollInit( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pObjRi, * pObjRo;
    int f, i;
    Vec_IntFill( &p->vCopies, nFrames * Gia_ManObjNum(p), -1 );
    pNew = Gia_ManStart( nFrames * Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManForEachRo( p, pObj, i )
        Gia_ObjSetCopyF( p, 0, pObj, 0 );
    for ( f = 0; f < nFrames; f++ )
    {
        Gia_ObjSetCopyF( p, f, Gia_ManConst0(p), 0 );
        Gia_ManForEachPi( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManAppendCi(pNew) );
        Gia_ManForEachAnd( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ManHashAnd(pNew, Gia_ObjFanin0CopyF(p, f, pObj), Gia_ObjFanin1CopyF(p, f, pObj)) );
        Gia_ManForEachCo( p, pObj, i )
            Gia_ObjSetCopyF( p, f, pObj, Gia_ObjFanin0CopyF(p, f, pObj) );
        Gia_ManForEachPo( p, pObj, i )
            Gia_ManAppendCo( pNew, Gia_ObjCopyF(p, f, pObj) );
        if ( f == nFrames - 1 )
            break;
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, i )
            Gia_ObjSetCopyF( p, f+1, pObjRo, Gia_ObjCopyF(p, f, pObjRi) );
    }
    Gia_ManHashStop( pNew );
    return pNew;
}